

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSynchWaitController::CanThreadWaitWithoutBlocking
          (CSynchWaitController *this,bool *pfCanWaitWithoutBlocking,bool *pfAbandoned)

{
  bool bVar1;
  bool bVar2;
  CPalThread *pCVar3;
  CProcProcessLocalData *pCVar4;
  DWORD local_30;
  bool local_29;
  DWORD dwExitCode;
  bool fIsActualExitCode;
  
  pCVar3 = (CPalThread *)pthread_getspecific(thObjKey);
  if (pCVar3 == (CPalThread *)0x0) {
    pCVar3 = CreateCurrentThreadData();
  }
  if (pCVar3 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","CanThreadWaitWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x99);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (pfCanWaitWithoutBlocking == (bool *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CanThreadWaitWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x9a);
    fprintf(_stderr,"Expression: NULL != pfCanWaitWithoutBlocking\n");
  }
  if (pfAbandoned == (bool *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CanThreadWaitWithoutBlocking",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x9b);
    fprintf(_stderr,"Expression: NULL != pfAbandoned\n");
  }
  bVar1 = CSynchData::CanWaiterWaitWithoutBlocking
                    ((this->super_CSynchControllerBase).m_psdSynchData,
                     (this->super_CSynchControllerBase).m_pthrOwner,pfAbandoned);
  if ((!bVar1) &&
     (((this->super_CSynchControllerBase).m_psdSynchData)->m_otiObjectTypeId == otiProcess)) {
    pCVar4 = GetProcessLocalData(this);
    local_30 = 0;
    local_29 = false;
    if (pCVar4 == (CProcProcessLocalData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","CanThreadWaitWithoutBlocking",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
              ,0xb9);
      fprintf(_stderr,
              "Expression: NULL != pProcLocalData, Description: Process synch data pointer is missing\n"
             );
    }
    else {
      bVar2 = CPalSynchronizationManager::HasProcessExited(*(DWORD *)pCVar4,&local_30,&local_29);
      if (bVar2) {
        if (PAL_InitializeChakraCoreCalled == false) {
          abort();
        }
        if (local_29 == true) {
          *(DWORD *)(pCVar4 + 8) = local_30;
        }
        *(undefined4 *)(pCVar4 + 4) = 3;
        CSynchData::SetSignalCount((this->super_CSynchControllerBase).m_psdSynchData,1);
        CSynchData::ReleaseAllLocalWaiters
                  ((this->super_CSynchControllerBase).m_psdSynchData,
                   (this->super_CSynchControllerBase).m_pthrOwner);
        bVar1 = true;
      }
    }
  }
  *pfCanWaitWithoutBlocking = bVar1;
  return 0;
}

Assistant:

PAL_ERROR CSynchWaitController::CanThreadWaitWithoutBlocking(
        bool * pfCanWaitWithoutBlocking,
        bool * pfAbandoned)
    {
        VALIDATEOBJECT(m_psdSynchData);

        bool fRetVal = false;
        
        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(NULL != pfCanWaitWithoutBlocking);
        _ASSERTE(NULL != pfAbandoned);

        fRetVal = m_psdSynchData->CanWaiterWaitWithoutBlocking(m_pthrOwner, pfAbandoned);

        if(!fRetVal && otiProcess == m_psdSynchData->GetObjectTypeId())
        {
            // Note: if the target object is a process, here we need to check 
            // whether or not it has already exited. In fact, since currently 
            // we do not monitor a process status as long as there is no 
            // thread waiting on it, in general if the process already exited 
            // the process object is likely not to be signaled yet, therefore 
            // the above CanWaiterWaitWithoutBlocking call probably returned 
            // false, and, without the check below, that would cause the 
            // current thread to eventually go to sleep for a short time 
            // (until the worker thread notifies that the waited process has
            // indeed exited), while it would not be necessary.
            // As side effect that would cause a WaitForSingleObject with zero 
            // timeout to always return WAIT_TIMEOUT, even though the target 
            // process already exited. WaitForSingleObject with zero timeout 
            // is a common way to probe whether or not a process has already 
            // exited, and it is supposed to return WAIT_OBJECT_0 if the 
            // process exited, and WAIT_TIMEOUT if it is still active.
            // In order to support this feature we need to check at this time 
            // whether or not the process has already exited.
           
            CProcProcessLocalData * pProcLocalData = GetProcessLocalData();
            DWORD dwExitCode = 0;
            bool fIsActualExitCode = false;

            _ASSERT_MSG(NULL != pProcLocalData, 
                        "Process synch data pointer is missing\n");
            
            if (NULL != pProcLocalData && 
                CPalSynchronizationManager::HasProcessExited(pProcLocalData->dwProcessId, 
                                                             &dwExitCode, 
                                                             &fIsActualExitCode))
            {
                TRACE("Process pid=%u exited with %s exitcode=%u\n",
                      pProcLocalData->dwProcessId, 
                      fIsActualExitCode ? "actual" : "guessed",
                      dwExitCode);

                // Store the exit code in the process local data
                if (fIsActualExitCode)
                {
                    pProcLocalData->dwExitCode = dwExitCode;
                }

                // Set process status to PS_DONE
                pProcLocalData->ps = PS_DONE;

                // Set signal count
                m_psdSynchData->SetSignalCount(1);

                // Releasing all local waiters 
                // (see comments in DoMonitorProcesses)
                m_psdSynchData->ReleaseAllLocalWaiters(m_pthrOwner);
                
                fRetVal = true;
            }
        }

        *pfCanWaitWithoutBlocking = fRetVal;
        return NO_ERROR;
    }